

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib503.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  int ec_11;
  CURLMcode ec_10;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_1fc;
  CURLMcode ec_9;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_38;
  int local_30;
  int local_2c;
  int running;
  int res;
  CURLM *m;
  CURL *c;
  char *URL_local;
  
  m = (CURLM *)0x0;
  _running = 0;
  local_2c = 0;
  c = (CURL *)URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_38 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_38;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                  ,0x2f,iVar2,uVar3);
    local_2c = iVar2;
  }
  if (local_2c == 0) {
    m = (CURLM *)curl_easy_init();
    if (m == (CURLM *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                    ,0x31);
      local_2c = 0x7c;
    }
    if (local_2c == 0) {
      iVar2 = curl_easy_setopt(m,0x2714,libtest_arg2);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                      ,0x33,iVar2,uVar3);
        local_2c = iVar2;
      }
      if (local_2c == 0) {
        iVar2 = curl_easy_setopt(m,0x2712,c);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                        ,0x34,iVar2,uVar3);
          local_2c = iVar2;
        }
        if (local_2c == 0) {
          iVar2 = curl_easy_setopt(m,0x2715,"test:ing");
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                          ,0x35,iVar2,uVar3);
            local_2c = iVar2;
          }
          if (local_2c == 0) {
            iVar2 = curl_easy_setopt(m,0x2716,"test:ing");
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                            ,0x36,iVar2,uVar3);
              local_2c = iVar2;
            }
            if (local_2c == 0) {
              iVar2 = curl_easy_setopt(m,0x3d,1);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                              ,0x37,iVar2,uVar3);
                local_2c = iVar2;
              }
              if (local_2c == 0) {
                iVar2 = curl_easy_setopt(m,0x2a,1);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                ,0x38,iVar2,uVar3);
                  local_2c = iVar2;
                }
                if (local_2c == 0) {
                  iVar2 = curl_easy_setopt(m,0x29,1);
                  uVar1 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_easy_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                  ,0x39,iVar2,uVar3);
                    local_2c = iVar2;
                  }
                  if (local_2c == 0) {
                    _running = curl_multi_init();
                    if (_running == 0) {
                      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                    ,0x3b);
                      local_2c = 0x7b;
                    }
                    if (local_2c == 0) {
                      iVar2 = curl_multi_add_handle(_running,m);
                      uVar1 = _stderr;
                      if (iVar2 != 0) {
                        uVar3 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                      ,0x3d,iVar2,uVar3);
                        local_2c = iVar2;
                      }
                      if (local_2c == 0) {
                        while( true ) {
                          local_1fc = -99;
                          rd.__fds_bits[0xf] = 1;
                          iVar2 = curl_multi_perform(_running,&local_30);
                          uVar1 = _stderr;
                          if (iVar2 == 0) {
                            if (local_30 < 0) {
                              curl_mfprintf(_stderr,
                                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                            ,0x47,local_30);
                              local_2c = 0x7a;
                            }
                          }
                          else {
                            uVar3 = curl_multi_strerror(iVar2);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                          ,0x47,iVar2,uVar3);
                            local_2c = iVar2;
                          }
                          if (local_2c != 0) break;
                          tVar7 = tutil_tvnow();
                          older.tv_usec = tv_test_start.tv_usec;
                          older.tv_sec = tv_test_start.tv_sec;
                          lVar4 = tutil_tvdiff(tVar7,older);
                          if (60000 < lVar4) {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                          ,0x49);
                            local_2c = 0x7d;
                          }
                          if ((local_2c != 0) || (local_30 == 0)) break;
                          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                            wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                          }
                          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                              __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                            exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                          }
                          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10;
                              __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                            (&ec_9 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
                            (&ec_9 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
                          }
                          iVar2 = curl_multi_fdset(_running,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf
                                                   ,&ec_9,&local_1fc);
                          uVar1 = _stderr;
                          if (iVar2 == 0) {
                            if (local_1fc < -1) {
                              curl_mfprintf(_stderr,
                                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                            ,0x52,local_1fc);
                              local_2c = 0x7a;
                            }
                          }
                          else {
                            uVar3 = curl_multi_strerror(iVar2);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                          ,0x52,iVar2,uVar3);
                            local_2c = iVar2;
                          }
                          if (local_2c != 0) break;
                          iVar2 = select_wrapper(local_1fc + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                                 (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)&ec_9,
                                                 (timeval *)(rd.__fds_bits + 0xf));
                          if (iVar2 == -1) {
                            piVar5 = __errno_location();
                            uVar1 = _stderr;
                            iVar2 = *piVar5;
                            pcVar6 = strerror(iVar2);
                            curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                          ,0x56,iVar2,pcVar6);
                            local_2c = 0x79;
                          }
                          if (local_2c != 0) break;
                          tVar7 = tutil_tvnow();
                          older_00.tv_usec = tv_test_start.tv_usec;
                          older_00.tv_sec = tv_test_start.tv_sec;
                          lVar4 = tutil_tvdiff(tVar7,older_00);
                          if (60000 < lVar4) {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib503.c"
                                          ,0x58);
                            local_2c = 0x7d;
                          }
                          if (local_2c != 0) break;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_remove_handle(_running,m);
    curl_multi_cleanup(_running);
    curl_easy_cleanup(m);
    curl_global_cleanup();
    URL_local._4_4_ = local_2c;
  }
  else {
    URL_local._4_4_ = local_2c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_PROXY, libtest_arg2); /* set in first.c */
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_USERPWD, "test:ing");
  easy_setopt(c, CURLOPT_PROXYUSERPWD, "test:ing");
  easy_setopt(c, CURLOPT_HTTPPROXYTUNNEL, 1L);
  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}